

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O1

void yy_5_structural_infix_expr
               (GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  G->ss = G->val[-2];
  return;
}

Assistant:

YY_ACTION(void) yy_5_structural_infix_expr(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define a2 G->val[-1]
#define a1 G->val[-2]
  yyprintf((stderr, "do yy_5_structural_infix_expr"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {yy=a1; }\n"));
  yy=a1; ;
#undef a2
#undef a1
}